

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataGroup.cpp
# Opt level: O1

bool __thiscall DL::DataGroup::isAllNamedOfType(DataGroup *this,DataType type)

{
  element_type *peVar1;
  pointer pDVar2;
  pointer pDVar3;
  pointer pDVar4;
  bool bVar5;
  
  peVar1 = (this->mShared).super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    __assert_fail("(mShared)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/PearCoding[P]DataLisp/src/DataGroup.cpp"
                  ,0xfa,"bool DL::DataGroup::isAllNamedOfType(DL::DataType) const");
  }
  pDVar2 = (peVar1->NamedData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar3 = *(pointer *)
            ((long)&(peVar1->NamedData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if ((pDVar2 == pDVar3) || (pDVar2->mType != type)) {
    bVar5 = false;
  }
  else {
    do {
      bVar5 = pDVar2 + 1 == pDVar3;
      if (bVar5) {
        return bVar5;
      }
      pDVar4 = pDVar2 + 1;
      pDVar2 = pDVar2 + 1;
    } while (pDVar4->mType == type);
  }
  return bVar5;
}

Assistant:

bool DataGroup::isAllNamedOfType(DL::DataType type) const
{
	DL_ASSERT(mShared);

	if (mShared->NamedData.empty())
		return false;

	for (const Data& d : mShared->NamedData) {
		if (d.type() != type)
			return false;
	}

	return true;
}